

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O1

int pt_blk_proceed_to_iret
              (pt_block_decoder *decoder,pt_block *block,pt_insn *insn,pt_insn_ext *iext,
              pt_event *ev)

{
  anon_union_16_5_d9daf2ef_for_variant aVar1;
  int iVar2;
  
  iVar2 = -1;
  if (ev != (pt_event *)0x0 && insn != (pt_insn *)0x0) {
    if ((ev->field_0x4 & 1) == 0) {
      iVar2 = pt_blk_proceed_to_ip(decoder,block,insn,iext,(ev->variant).enabled.ip);
      if (iVar2 < 1) {
        return iVar2;
      }
      iVar2 = pt_blk_proceed_one_insn(decoder,block,insn,iext);
      if (iVar2 < 1) {
        return iVar2;
      }
    }
    else {
      iVar2 = pt_blk_proceed_one_insn(decoder,block,insn,iext);
      if (0 < iVar2) {
        do {
          iVar2 = pt_insn_is_iret(insn,iext);
          if ((iVar2 != 0) || (iVar2 = pt_insn_next_ip(&decoder->ip,insn,iext), iVar2 < 0)) break;
          aVar1 = (decoder->flags).variant;
          if ((((undefined1  [16])((undefined1  [16])aVar1 & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) && (insn->iclass == ptic_call)) ||
             (((undefined1  [16])((undefined1  [16])aVar1 & (undefined1  [16])0x4) !=
               (undefined1  [16])0x0 && (insn->iclass == ptic_jump)))) {
            iVar2 = 0;
            break;
          }
          iVar2 = pt_blk_proceed_one_insn(decoder,block,insn,iext);
        } while (0 < iVar2);
      }
      if (iVar2 < 1) {
        return iVar2;
      }
      (ev->variant).disabled.ip = insn->ip;
      ev->field_0x4 = ev->field_0x4 & 0xfe;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int pt_blk_proceed_to_iret(struct pt_block_decoder *decoder,
				  struct pt_block *block,
				  struct pt_insn *insn,
				  struct pt_insn_ext *iext,
				  struct pt_event *ev)
{
	int status;

	if (!insn || !ev)
		return -pte_internal;

	/* If we don't have an IP, the event binds to the next IRET
	 * instruction.
	 *
	 * If we have an IP it still binds to the next IRET instruction but now
	 * the IP tells us where that instruction is.  This makes most sense
	 * when tracing is disabled and we don't have any other means of
	 * finding the IRET instruction.  We nevertheless distinguish the two
	 * cases, here.
	 *
	 * In both cases, we move beyond the IRET instruction, so it will be
	 * the last instruction in the current block and @decoder->ip will
	 * point to the instruction following it.
	 */
	if (ev->ip_suppressed) {
		status = pt_blk_proceed_to_insn(decoder, block, insn, iext,
						pt_insn_is_iret);
		if (status <= 0)
			return status;

		/* We now know the IP of the IRET instruction corresponding to
		 * this event.  Fill it in to make it more convenient for the
		 * user to process the event.
		 */
		ev->variant.iret.ip = insn->ip;
		ev->ip_suppressed = 0;
	} else {
		status = pt_blk_proceed_to_ip(decoder, block, insn, iext,
					      ev->variant.iret.ip);
		if (status <= 0)
			return status;

		/* We reached the IRET instruction and @decoder->ip points to
		 * it; @insn/@iext still contain the preceding instruction.
		 *
		 * Proceed beyond the IRET to account for it.  Note that we may
		 * still overflow the block, which would cause us to postpone
		 * both instruction and event to the next block.
		 */
		status = pt_blk_proceed_one_insn(decoder, block, insn, iext);
		if (status <= 0)
			return status;
	}

	return 1;
}